

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_binary_insertion_sort_start(int64_t *dst,size_t start,size_t size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  do {
    if (size <= start) {
      return;
    }
    lVar1 = dst[start];
    if (lVar1 < dst[start - 1]) {
      uVar2 = start - 1;
      if (*dst <= lVar1) {
        uVar3 = uVar2 >> 1;
        uVar5 = 0;
        uVar4 = uVar2;
        do {
          if ((int)lVar1 - (int)dst[uVar3] < 0) {
            uVar6 = uVar3 - uVar5;
            uVar4 = uVar3;
            if (uVar6 < 2) goto LAB_001039f7;
          }
          else {
            uVar6 = uVar4 - uVar3;
            uVar5 = uVar3;
            if (uVar6 < 2) {
              uVar3 = uVar3 + 1;
              goto LAB_001039f7;
            }
          }
          uVar3 = (uVar6 >> 1) + uVar5;
        } while( true );
      }
      uVar3 = 0;
LAB_001039f7:
      do {
        if (uVar2 < uVar3) break;
        dst[uVar2 + 1] = dst[uVar2];
        bVar7 = uVar2 != 0;
        uVar2 = uVar2 - 1;
      } while (bVar7);
      dst[uVar3] = lVar1;
    }
    start = start + 1;
  } while( true );
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start,
                                        const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze
     * in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}